

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamListStandard::assignMap
          (ParamListStandard *this,vector<Datatype_*,_std::allocator<Datatype_*>_> *proto,
          bool isinput,TypeFactory *typefactory,
          vector<ParameterPieces,_std::allocator<ParameterPieces>_> *res)

{
  int iVar1;
  value_type pDVar2;
  undefined8 uVar3;
  uint4 s;
  pointer piVar4;
  bool bVar5;
  int4 iVar6;
  type_metatype tVar7;
  size_type sVar8;
  reference pvVar9;
  ulong uVar10;
  const_reference ppDVar11;
  Architecture *this_00;
  ParamUnassignedError *pPVar12;
  string local_168 [32];
  undefined1 local_148 [16];
  undefined1 local_138 [39];
  undefined1 local_111;
  string local_110 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [24];
  Datatype *pointertp;
  int4 wordsize;
  int4 pointersize;
  AddrSpace *spc;
  pointer pprStack_b0;
  Datatype *local_a8;
  AddrSpace *pAStack_a0;
  int local_98;
  undefined1 local_91;
  int4 i;
  undefined1 local_70 [36];
  value_type_conflict1 local_4c;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> status;
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> *res_local;
  TypeFactory *typefactory_local;
  bool isinput_local;
  vector<Datatype_*,_std::allocator<Datatype_*>_> *proto_local;
  ParamListStandard *this_local;
  
  iVar1 = this->numgroup;
  local_4c = 0;
  status.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)res;
  std::allocator<int>::allocator((allocator<int> *)(local_70 + 0x23));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar1,&local_4c,
             (allocator<int> *)(local_70 + 0x23));
  std::allocator<int>::~allocator((allocator<int> *)(local_70 + 0x23));
  piVar4 = status.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (isinput) {
    sVar8 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::size
                      ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                       status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (sVar8 == 2) {
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      assignAddress((ParamListStandard *)local_70,(Datatype *)this,
                    (vector<int,_std::allocator<int>_> *)pvVar9->type);
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      Address::operator=(&pvVar9->addr,(Address *)local_70);
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      *(byte *)((long)&pvVar9->flags + 3) = *(byte *)((long)&pvVar9->flags + 3) | 0x20;
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar5 = Address::isInvalid(&pvVar9->addr);
      if (bVar5) {
        local_91 = 1;
        pPVar12 = (ParamUnassignedError *)__cxa_allocate_exception(0x20);
        pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                           ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                            status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        Datatype::getName_abi_cxx11_(pvVar9->type);
        std::operator+((char *)&i,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Cannot assign parameter address for ");
        ParamUnassignedError::ParamUnassignedError(pPVar12,(string *)&i);
        local_91 = 0;
        __cxa_throw(pPVar12,&ParamUnassignedError::typeinfo,
                    ParamUnassignedError::~ParamUnassignedError);
      }
    }
    for (local_98 = 1; uVar10 = (ulong)local_98,
        sVar8 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::size(proto),
        piVar4 = status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, uVar10 < sVar8; local_98 = local_98 + 1)
    {
      local_a8 = (Datatype *)0x0;
      pAStack_a0 = (AddrSpace *)0x0;
      spc = (AddrSpace *)0x0;
      pprStack_b0 = (pointer)0x0;
      ParameterPieces::ParameterPieces((ParameterPieces *)&spc);
      std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::push_back
                ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)piVar4,
                 (value_type *)&spc);
      if (this->pointermax == 0) {
LAB_00507c71:
        ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[]
                             (proto,(long)local_98);
        assignAddress((ParamListStandard *)local_f0,(Datatype *)this,
                      (vector<int,_std::allocator<int>_> *)*ppDVar11);
        pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                           ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                            status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        Address::operator=(&pvVar9->addr,(Address *)local_f0);
      }
      else {
        ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[]
                             (proto,(long)local_98);
        iVar6 = Datatype::getSize(*ppDVar11);
        if (iVar6 <= this->pointermax) goto LAB_00507c71;
        _wordsize = this->spacebase;
        if (_wordsize == (AddrSpace *)0x0) {
          this_00 = TypeFactory::getArch(typefactory);
          _wordsize = AddrSpaceManager::getDefaultSpace(&this_00->super_AddrSpaceManager);
        }
        pointertp._4_4_ = AddrSpace::getAddrSize(_wordsize);
        pointertp._0_4_ = AddrSpace::getWordSize(_wordsize);
        s = pointertp._4_4_;
        ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[]
                             (proto,(long)local_98);
        local_e0._16_8_ =
             TypeFactory::getTypePointerAbsolute(typefactory,s,*ppDVar11,(uint4)pointertp);
        assignAddress((ParamListStandard *)local_e0,(Datatype *)this,
                      (vector<int,_std::allocator<int>_> *)local_e0._16_8_);
        pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                           ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                            status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        Address::operator=(&pvVar9->addr,(Address *)local_e0);
        uVar3 = local_e0._16_8_;
        pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                           ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                            status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        pvVar9->type = (Datatype *)uVar3;
        pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                           ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                            status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        pvVar9->flags = 0x10000000;
      }
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar5 = Address::isInvalid(&pvVar9->addr);
      if (bVar5) {
        local_111 = 1;
        pPVar12 = (ParamUnassignedError *)__cxa_allocate_exception(0x20);
        ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[]
                             (proto,(long)local_98);
        Datatype::getName_abi_cxx11_(*ppDVar11);
        std::operator+((char *)local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Cannot assign parameter address for ");
        ParamUnassignedError::ParamUnassignedError(pPVar12,local_110);
        local_111 = 0;
        __cxa_throw(pPVar12,&ParamUnassignedError::typeinfo,
                    ParamUnassignedError::~ParamUnassignedError);
      }
      ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[]
                           (proto,(long)local_98);
      pDVar2 = *ppDVar11;
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar9->type = pDVar2;
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar9->flags = 0;
    }
  }
  else {
    local_138._16_8_ = (Datatype *)0x0;
    local_138._24_8_ = (_List_node_base *)0x0;
    local_138._0_8_ = (AddrSpace *)0x0;
    local_138._8_8_ = 0;
    ParameterPieces::ParameterPieces((ParameterPieces *)local_138);
    std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::push_back
              ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)piVar4,
               (value_type *)local_138);
    ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
    tVar7 = Datatype::getMetatype(*ppDVar11);
    if (tVar7 != TYPE_VOID) {
      ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
      assignAddress((ParamListStandard *)local_148,(Datatype *)this,
                    (vector<int,_std::allocator<int>_> *)*ppDVar11);
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      Address::operator=(&pvVar9->addr,(Address *)local_148);
      pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                         ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                          status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar5 = Address::isInvalid(&pvVar9->addr);
      if (bVar5) {
        pPVar12 = (ParamUnassignedError *)__cxa_allocate_exception(0x20);
        ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
        Datatype::getName_abi_cxx11_(*ppDVar11);
        std::operator+((char *)local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Cannot assign parameter address for ");
        ParamUnassignedError::ParamUnassignedError(pPVar12,local_168);
        __cxa_throw(pPVar12,&ParamUnassignedError::typeinfo,
                    ParamUnassignedError::~ParamUnassignedError);
      }
    }
    ppDVar11 = std::vector<Datatype_*,_std::allocator<Datatype_*>_>::operator[](proto,0);
    pDVar2 = *ppDVar11;
    pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pvVar9->type = pDVar2;
    pvVar9 = std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::back
                       ((vector<ParameterPieces,_std::allocator<ParameterPieces>_> *)
                        status.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pvVar9->flags = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void ParamListStandard::assignMap(const vector<Datatype *> &proto,bool isinput,TypeFactory &typefactory,
				  vector<ParameterPieces> &res) const

{
  vector<int4> status(numgroup,0);

  if (isinput) {
    if (res.size()==2) { // Check for hidden parameters defined by the output list
      res.back().addr = assignAddress(res.back().type,status); // Reserve first param for hidden ret value
      res.back().flags |= Varnode::hiddenretparm;
      if (res.back().addr.isInvalid())
	throw ParamUnassignedError("Cannot assign parameter address for " + res.back().type->getName());
    }
    for(int4 i=1;i<proto.size();++i) {
      res.push_back(ParameterPieces());
      if ((pointermax != 0)&&(proto[i]->getSize() > pointermax)) { // Datatype is too big
	// Assume datatype is stored elsewhere and only the pointer is passed
	AddrSpace *spc = spacebase;
	if (spc == (AddrSpace *)0)
	  spc = typefactory.getArch()->getDefaultSpace();
	int4 pointersize = spc->getAddrSize();
	int4 wordsize = spc->getWordSize();
	Datatype *pointertp = typefactory.getTypePointerAbsolute(pointersize,proto[i],wordsize);
	res.back().addr = assignAddress(pointertp,status);
	res.back().type = pointertp;
	res.back().flags = Varnode::indirectstorage;
      }
      else
	res.back().addr = assignAddress(proto[i],status);
      if (res.back().addr.isInvalid())
	throw ParamUnassignedError("Cannot assign parameter address for " + proto[i]->getName());
      res.back().type = proto[i];
      res.back().flags = 0;
    }
  }
  else {
    res.push_back(ParameterPieces());
    if (proto[0]->getMetatype() != TYPE_VOID) {
      res.back().addr = assignAddress(proto[0],status);
      if (res.back().addr.isInvalid())
	throw ParamUnassignedError("Cannot assign parameter address for " + proto[0]->getName());
    }
    res.back().type = proto[0];
    res.back().flags = 0;
  }
}